

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionModel::SetAllShapesMaterial
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *mat)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  int iVar3;
  pointer psVar4;
  pointer psVar5;
  
  psVar5 = (this->m_shapes).
           super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = (this->m_shapes).
           super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)psVar5 - (long)psVar4) >> 4) != 0) {
    iVar2 = (*((((psVar4->
                 super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_material).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ChMaterialSurface[3])();
    iVar3 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if (iVar2 != iVar3) {
      __assert_fail("GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModel.cpp"
                    ,0xa4,
                    "void chrono::collision::ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    psVar4 = (this->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (psVar4 != psVar5) {
    __r = &(mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount;
    do {
      peVar1 = (psVar4->
               super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar4->
                super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (peVar1->m_material).
        super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(peVar1->m_material).
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__r);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        (peVar1->m_material).
        super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(peVar1->m_material).
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__r);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar5);
  }
  return;
}

Assistant:

void ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface> mat) {
    assert(GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod());
    for (auto shape : m_shapes)
        shape->m_material = mat;
}